

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zero_copy_stream.cc
# Opt level: O0

bool __thiscall
google::protobuf::io::ZeroCopyOutputStream::WriteCord(ZeroCopyOutputStream *this,Cord *cord)

{
  CordRepBtree **this_00;
  void *pvVar1;
  bool bVar2;
  uint uVar3;
  size_type sVar4;
  const_pointer pvVar5;
  undefined1 local_180 [8];
  string_view fragment;
  ChunkIterator __end2;
  ChunkIterator __begin2;
  ChunkRange *__range2;
  void *pvStack_28;
  int buffer_size;
  void *buffer;
  Cord *cord_local;
  ZeroCopyOutputStream *this_local;
  
  buffer = cord;
  cord_local = (Cord *)this;
  bVar2 = absl::lts_20250127::Cord::empty(cord);
  if (bVar2) {
    this_local._7_1_ = true;
  }
  else {
    __range2._4_4_ = 0;
    uVar3 = (*this->_vptr_ZeroCopyOutputStream[2])
                      (this,&stack0xffffffffffffffd8,(long)&__range2 + 4);
    if ((uVar3 & 1) == 0) {
      this_local._7_1_ = false;
    }
    else {
      __begin2.btree_reader_.navigator_.node_[0xb] =
           (CordRepBtree *)absl::lts_20250127::Cord::Chunks((Cord *)buffer);
      this_00 = __begin2.btree_reader_.navigator_.node_ + 0xb;
      absl::lts_20250127::Cord::ChunkRange::begin
                ((ChunkIterator *)(__end2.btree_reader_.navigator_.node_ + 0xb),
                 (ChunkRange *)this_00);
      absl::lts_20250127::Cord::ChunkRange::end
                ((ChunkIterator *)&fragment._M_str,(ChunkRange *)this_00);
      while (bVar2 = absl::lts_20250127::Cord::ChunkIterator::operator!=
                               ((ChunkIterator *)(__end2.btree_reader_.navigator_.node_ + 0xb),
                                (ChunkIterator *)&fragment._M_str), bVar2) {
        _local_180 = absl::lts_20250127::Cord::ChunkIterator::operator*
                               ((ChunkIterator *)(__end2.btree_reader_.navigator_.node_ + 0xb));
        while (sVar4 = std::basic_string_view<char,_std::char_traits<char>_>::size
                                 ((basic_string_view<char,_std::char_traits<char>_> *)local_180),
              pvVar1 = pvStack_28, (ulong)(long)(int)__range2._4_4_ < sVar4) {
          pvVar5 = std::basic_string_view<char,_std::char_traits<char>_>::data
                             ((basic_string_view<char,_std::char_traits<char>_> *)local_180);
          memcpy(pvVar1,pvVar5,(long)(int)__range2._4_4_);
          std::basic_string_view<char,_std::char_traits<char>_>::remove_prefix
                    ((basic_string_view<char,_std::char_traits<char>_> *)local_180,
                     (long)(int)__range2._4_4_);
          uVar3 = (*this->_vptr_ZeroCopyOutputStream[2])
                            (this,&stack0xffffffffffffffd8,(long)&__range2 + 4);
          if ((uVar3 & 1) == 0) {
            return false;
          }
        }
        pvVar5 = std::basic_string_view<char,_std::char_traits<char>_>::data
                           ((basic_string_view<char,_std::char_traits<char>_> *)local_180);
        sVar4 = std::basic_string_view<char,_std::char_traits<char>_>::size
                          ((basic_string_view<char,_std::char_traits<char>_> *)local_180);
        memcpy(pvVar1,pvVar5,sVar4);
        pvVar1 = pvStack_28;
        sVar4 = std::basic_string_view<char,_std::char_traits<char>_>::size
                          ((basic_string_view<char,_std::char_traits<char>_> *)local_180);
        pvStack_28 = (void *)((long)pvVar1 + sVar4);
        sVar4 = std::basic_string_view<char,_std::char_traits<char>_>::size
                          ((basic_string_view<char,_std::char_traits<char>_> *)local_180);
        __range2._4_4_ = __range2._4_4_ - (int)sVar4;
        absl::lts_20250127::Cord::ChunkIterator::operator++
                  ((ChunkIterator *)(__end2.btree_reader_.navigator_.node_ + 0xb));
      }
      (*this->_vptr_ZeroCopyOutputStream[3])(this,(ulong)__range2._4_4_);
      this_local._7_1_ = true;
    }
  }
  return this_local._7_1_;
}

Assistant:

bool ZeroCopyOutputStream::WriteCord(const absl::Cord& cord) {
  if (cord.empty()) return true;

  void* buffer;
  int buffer_size = 0;
  if (!Next(&buffer, &buffer_size)) return false;

  for (absl::string_view fragment : cord.Chunks()) {
    while (fragment.size() > static_cast<size_t>(buffer_size)) {
      std::memcpy(buffer, fragment.data(), buffer_size);

      fragment.remove_prefix(buffer_size);

      if (!Next(&buffer, &buffer_size)) return false;
    }
    std::memcpy(buffer, fragment.data(), fragment.size());

    // Advance the buffer.
    buffer = static_cast<char*>(buffer) + fragment.size();
    buffer_size -= static_cast<int>(fragment.size());
  }
  BackUp(buffer_size);
  return true;
}